

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
FeaturesTest_InvalidFieldNonStringMapWithStringValidation_Test::
~FeaturesTest_InvalidFieldNonStringMapWithStringValidation_Test
          (FeaturesTest_InvalidFieldNonStringMapWithStringValidation_Test *this)

{
  FeaturesTest_InvalidFieldNonStringMapWithStringValidation_Test *this_local;
  
  ~FeaturesTest_InvalidFieldNonStringMapWithStringValidation_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFieldNonStringMapWithStringValidation) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        message_type {
          name: "Foo"
          nested_type {
            name: "MapFieldEntry"
            field {
              name: "key"
              number: 1
              label: LABEL_OPTIONAL
              type: TYPE_INT32
              options {
                uninterpreted_option {
                  name { name_part: "features" is_extension: false }
                  name { name_part: "utf8_validation" is_extension: false }
                  identifier_value: "NONE"
                }
              }
            }
            field {
              name: "value"
              number: 2
              label: LABEL_OPTIONAL
              type: TYPE_INT32
              options {
                uninterpreted_option {
                  name { name_part: "features" is_extension: false }
                  name { name_part: "utf8_validation" is_extension: false }
                  identifier_value: "NONE"
                }
              }
            }
            options { map_entry: true }
          }
          field {
            name: "map_field"
            number: 1
            label: LABEL_REPEATED
            type_name: "MapFieldEntry"
            options {
              uninterpreted_option {
                name { name_part: "features" is_extension: false }
                name { name_part: "utf8_validation" is_extension: false }
                identifier_value: "NONE"
              }
            }
          }
        }
      )pb",
      "foo.proto: Foo.map_field: NAME: Only string fields can specify "
      "utf8 validation.\n");
}